

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O0

void ZydisFormatterBufferInitTokenized
               (ZydisFormatterBuffer *buffer,ZydisFormatterToken **first_token,void *user_buffer,
               ZyanUSize length)

{
  ZyanUSize length_local;
  void *user_buffer_local;
  ZydisFormatterToken **first_token_local;
  ZydisFormatterBuffer *buffer_local;
  
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                  ,0x53,
                  "void ZydisFormatterBufferInitTokenized(ZydisFormatterBuffer *, ZydisFormatterToken **, void *, ZyanUSize)"
                 );
  }
  if (first_token == (ZydisFormatterToken **)0x0) {
    __assert_fail("first_token",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                  ,0x54,
                  "void ZydisFormatterBufferInitTokenized(ZydisFormatterBuffer *, ZydisFormatterToken **, void *, ZyanUSize)"
                 );
  }
  if (user_buffer == (void *)0x0) {
    __assert_fail("user_buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                  ,0x55,
                  "void ZydisFormatterBufferInitTokenized(ZydisFormatterBuffer *, ZydisFormatterToken **, void *, ZyanUSize)"
                 );
  }
  if (length != 0) {
    *first_token = (ZydisFormatterToken *)user_buffer;
    (*first_token)->type = '\0';
    (*first_token)->next = '\0';
    buffer->is_token_list = '\x01';
    buffer->capacity = length - 2;
    (buffer->string).flags = '\x01';
    (buffer->string).vector.allocator = (ZyanAllocator *)0x0;
    (buffer->string).vector.growth_factor = '\x01';
    (buffer->string).vector.shrink_threshold = '\0';
    (buffer->string).vector.destructor = (ZyanMemberProcedure)0x0;
    (buffer->string).vector.element_size = 1;
    (buffer->string).vector.size = 1;
    (buffer->string).vector.capacity = length - 2;
    (buffer->string).vector.data = (undefined1 *)((long)user_buffer + 2);
    *(undefined1 *)((long)user_buffer + 2) = 0;
    return;
  }
  __assert_fail("length",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                ,0x56,
                "void ZydisFormatterBufferInitTokenized(ZydisFormatterBuffer *, ZydisFormatterToken **, void *, ZyanUSize)"
               );
}

Assistant:

static void ZydisFormatterBufferInitTokenized(ZydisFormatterBuffer* buffer,
    ZydisFormatterToken** first_token, void* user_buffer, ZyanUSize length)
{
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(first_token);
    ZYAN_ASSERT(user_buffer);
    ZYAN_ASSERT(length);

    *first_token = user_buffer;
    (*first_token)->type = ZYDIS_TOKEN_INVALID;
    (*first_token)->next = 0;

    user_buffer = (ZyanU8*)user_buffer + sizeof(ZydisFormatterToken);
    length -= sizeof(ZydisFormatterToken);

    buffer->is_token_list                  = ZYAN_TRUE;
    buffer->capacity                       = length;
    buffer->string.flags                   = ZYAN_STRING_HAS_FIXED_CAPACITY;
    buffer->string.vector.allocator        = ZYAN_NULL;
    buffer->string.vector.growth_factor    = 1;
    buffer->string.vector.shrink_threshold = 0;
    buffer->string.vector.destructor       = ZYAN_NULL;
    buffer->string.vector.element_size     = sizeof(char);
    buffer->string.vector.size             = 1;
    buffer->string.vector.capacity         = length;
    buffer->string.vector.data             = user_buffer;

    *(char*)user_buffer = '\0';
}